

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInvert.cpp
# Opt level: O3

void anon_unknown.dwarf_8a53c::invertM44f(M44f *m,float e)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float *pfVar14;
  undefined8 *puVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  M44f inv2;
  M44f inv1;
  float local_198;
  float local_188;
  float local_178;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  Matrix44<float> local_98;
  Matrix44<float> local_58;
  
  Imath_3_2::Matrix44<float>::inverse(&local_58,m);
  Imath_3_2::Matrix44<float>::gjInverse(&local_98,m);
  fVar4 = m->x[0][0];
  fVar5 = m->x[0][1];
  fVar6 = m->x[0][2];
  fVar7 = m->x[0][3];
  fVar8 = m->x[1][0];
  fVar9 = m->x[1][1];
  fVar10 = m->x[1][2];
  fVar11 = m->x[2][2];
  pfVar14 = &local_d8;
  fVar12 = m->x[2][3];
  fVar13 = m->x[3][0];
  fVar1 = m->x[3][1];
  fVar2 = m->x[3][2];
  fVar3 = m->x[3][3];
  local_d8 = fVar7 * local_58.x[3][0] +
             fVar6 * local_58.x[2][0] + fVar4 * local_58.x[0][0] + fVar5 * local_58.x[1][0];
  fStack_d4 = fVar7 * local_58.x[3][1] +
              fVar6 * local_58.x[2][1] + fVar4 * local_58.x[0][1] + fVar5 * local_58.x[1][1];
  fStack_d0 = fVar7 * local_58.x[3][2] +
              fVar6 * local_58.x[2][2] + fVar4 * local_58.x[0][2] + fVar5 * local_58.x[1][2];
  fStack_cc = fVar7 * local_58.x[3][3] +
              fVar6 * local_58.x[2][3] + fVar4 * local_58.x[0][3] + fVar5 * local_58.x[1][3];
  local_178 = (float)*(undefined8 *)(m->x[1] + 3);
  local_c8 = local_178 * local_58.x[3][0] +
             fVar10 * local_58.x[2][0] + fVar8 * local_58.x[0][0] + local_58.x[1][0] * fVar9;
  fStack_c4 = local_178 * local_58.x[3][1] +
              fVar10 * local_58.x[2][1] + fVar8 * local_58.x[0][1] + local_58.x[1][1] * fVar9;
  fStack_c0 = local_178 * local_58.x[3][2] +
              fVar10 * local_58.x[2][2] + fVar8 * local_58.x[0][2] + local_58.x[1][2] * fVar9;
  fStack_bc = local_178 * local_58.x[3][3] +
              fVar10 * local_58.x[2][3] + fVar8 * local_58.x[0][3] + local_58.x[1][3] * fVar9;
  local_188 = (float)*(undefined8 *)(m->x[2] + 1);
  local_198 = (float)*(undefined8 *)m->x[2];
  local_b8 = fVar12 * local_58.x[3][0] +
             fVar11 * local_58.x[2][0] + local_198 * local_58.x[0][0] + local_58.x[1][0] * local_188
  ;
  fStack_b4 = fVar12 * local_58.x[3][1] +
              fVar11 * local_58.x[2][1] +
              local_198 * local_58.x[0][1] + local_58.x[1][1] * local_188;
  fStack_b0 = fVar12 * local_58.x[3][2] +
              fVar11 * local_58.x[2][2] +
              local_198 * local_58.x[0][2] + local_58.x[1][2] * local_188;
  fStack_ac = fVar12 * local_58.x[3][3] +
              fVar11 * local_58.x[2][3] +
              local_198 * local_58.x[0][3] + local_58.x[1][3] * local_188;
  local_a8 = local_58.x[3][0] * fVar3 +
             local_58.x[2][0] * fVar2 + local_58.x[0][0] * fVar13 + local_58.x[1][0] * fVar1;
  fStack_a4 = local_58.x[3][1] * fVar3 +
              local_58.x[2][1] * fVar2 + local_58.x[0][1] * fVar13 + local_58.x[1][1] * fVar1;
  fStack_a0 = local_58.x[3][2] * fVar3 +
              local_58.x[2][2] * fVar2 + local_58.x[0][2] * fVar13 + local_58.x[1][2] * fVar1;
  fStack_9c = local_58.x[3][3] * fVar3 +
              local_58.x[2][3] * fVar2 + local_58.x[0][3] * fVar13 + local_58.x[1][3] * fVar1;
  local_118 = fVar7 * local_98.x[3][0] +
              fVar6 * local_98.x[2][0] + fVar4 * local_98.x[0][0] + fVar5 * local_98.x[1][0];
  fStack_114 = fVar7 * local_98.x[3][1] +
               fVar6 * local_98.x[2][1] + fVar4 * local_98.x[0][1] + fVar5 * local_98.x[1][1];
  fStack_110 = fVar7 * local_98.x[3][2] +
               fVar6 * local_98.x[2][2] + fVar4 * local_98.x[0][2] + fVar5 * local_98.x[1][2];
  fStack_10c = fVar7 * local_98.x[3][3] +
               fVar6 * local_98.x[2][3] + fVar4 * local_98.x[0][3] + fVar5 * local_98.x[1][3];
  local_108 = local_178 * local_98.x[3][0] +
              fVar10 * local_98.x[2][0] + fVar8 * local_98.x[0][0] + fVar9 * local_98.x[1][0];
  fStack_104 = local_178 * local_98.x[3][1] +
               fVar10 * local_98.x[2][1] + fVar8 * local_98.x[0][1] + fVar9 * local_98.x[1][1];
  fStack_100 = local_178 * local_98.x[3][2] +
               fVar10 * local_98.x[2][2] + fVar8 * local_98.x[0][2] + fVar9 * local_98.x[1][2];
  fStack_fc = local_178 * local_98.x[3][3] +
              fVar10 * local_98.x[2][3] + fVar8 * local_98.x[0][3] + fVar9 * local_98.x[1][3];
  local_f8 = fVar12 * local_98.x[3][0] +
             fVar11 * local_98.x[2][0] + local_198 * local_98.x[0][0] + local_188 * local_98.x[1][0]
  ;
  fStack_f4 = fVar12 * local_98.x[3][1] +
              fVar11 * local_98.x[2][1] +
              local_198 * local_98.x[0][1] + local_188 * local_98.x[1][1];
  fStack_f0 = fVar12 * local_98.x[3][2] +
              fVar11 * local_98.x[2][2] +
              local_198 * local_98.x[0][2] + local_188 * local_98.x[1][2];
  fStack_ec = fVar12 * local_98.x[3][3] +
              fVar11 * local_98.x[2][3] +
              local_198 * local_98.x[0][3] + local_188 * local_98.x[1][3];
  local_e8 = fVar3 * local_98.x[3][0] +
             fVar2 * local_98.x[2][0] + fVar13 * local_98.x[0][0] + fVar1 * local_98.x[1][0];
  fStack_e4 = fVar3 * local_98.x[3][1] +
              fVar2 * local_98.x[2][1] + fVar13 * local_98.x[0][1] + fVar1 * local_98.x[1][1];
  fStack_e0 = fVar3 * local_98.x[3][2] +
              fVar2 * local_98.x[2][2] + fVar13 * local_98.x[0][2] + fVar1 * local_98.x[1][2];
  fStack_dc = fVar3 * local_98.x[3][3] +
              fVar2 * local_98.x[2][3] + fVar13 * local_98.x[0][3] + fVar1 * local_98.x[1][3];
  puVar15 = &Imath_3_2::identity44f;
  uVar16 = 0;
  bVar18 = false;
  do {
    lVar17 = 0;
    do {
      fVar1 = pfVar14[lVar17];
      fVar2 = *(float *)((long)puVar15 + lVar17 * 4);
      if (e < (float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                     (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1))) {
        if (!bVar18) {
          __assert_fail("ident1.equalWithAbsError (identity44f, e)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInvert.cpp"
                        ,0x22,"void (anonymous namespace)::invertM44f(const M44f &, float)");
        }
        goto LAB_00137686;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    bVar18 = 2 < uVar16;
    uVar16 = uVar16 + 1;
    puVar15 = puVar15 + 2;
    pfVar14 = pfVar14 + 4;
  } while (uVar16 != 4);
LAB_00137686:
  puVar15 = &Imath_3_2::identity44f;
  pfVar14 = &local_118;
  uVar16 = 0;
  bVar18 = false;
  do {
    lVar17 = 0;
    do {
      fVar1 = pfVar14[lVar17];
      fVar2 = *(float *)((long)puVar15 + lVar17 * 4);
      if (e < (float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                     (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1))) {
        if (bVar18) {
          return;
        }
        __assert_fail("ident2.equalWithAbsError (identity44f, e)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInvert.cpp"
                      ,0x23,"void (anonymous namespace)::invertM44f(const M44f &, float)");
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    bVar18 = 2 < uVar16;
    uVar16 = uVar16 + 1;
    puVar15 = puVar15 + 2;
    pfVar14 = pfVar14 + 4;
  } while (uVar16 != 4);
  return;
}

Assistant:

void
invertM44f (const M44f& m, float e)
{
    M44f inv1   = m.inverse ();
    M44f inv2   = m.gjInverse ();
    M44f ident1 = m * inv1;
    M44f ident2 = m * inv2;

    //cout << "m\n" << m << endl;
    //cout << "inv1\n" << inv1 << "ident1\n" << ident1 << endl;
    //cout << "inv2\n" << inv2 << "ident2\n" << ident2 << endl;

    assert (ident1.equalWithAbsError (identity44f, e));
    assert (ident2.equalWithAbsError (identity44f, e));
}